

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# munkres.hxx
# Opt level: O0

Index __thiscall
markurem::matching::
Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
::find_star_in_col(Matching<andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>,_std::vector<double,_std::allocator<double>_>,_std::vector<int,_std::allocator<int>_>_>
                   *this,Index col)

{
  bool bVar1;
  pointer pAVar2;
  Value VVar3;
  reference pvVar4;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  *in_RDI;
  AdjacencyIterator it;
  Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *in_stack_ffffffffffffffc8;
  __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
  local_20 [4];
  
  local_20[0]._M_current =
       (Adjacency<unsigned_long> *)
       andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::
       adjacenciesToVertexBegin(in_stack_ffffffffffffffc8,0x1d1535);
  while( true ) {
    andres::graph::Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_>::adjacenciesToVertexEnd
              (in_stack_ffffffffffffffc8,0x1d154c);
    bVar1 = __gnu_cxx::operator!=
                      (in_RDI,(__normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
                               *)in_stack_ffffffffffffffc8);
    if (!bVar1) {
      return 0xffffffffffffffff;
    }
    in_stack_ffffffffffffffc8 =
         (Digraph<andres::graph::IdleGraphVisitor<unsigned_long>_> *)in_RDI[2]._M_current;
    pAVar2 = __gnu_cxx::
             __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
             ::operator->(local_20);
    VVar3 = andres::graph::Adjacency<unsigned_long>::edge(pAVar2);
    pvVar4 = std::vector<int,_std::allocator<int>_>::operator[]
                       ((vector<int,_std::allocator<int>_> *)in_stack_ffffffffffffffc8,VVar3);
    if (*pvVar4 == 1) break;
    __gnu_cxx::
    __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
    ::operator++(local_20);
  }
  pAVar2 = __gnu_cxx::
           __normal_iterator<const_andres::graph::Adjacency<unsigned_long>_*,_std::vector<andres::graph::Adjacency<unsigned_long>,_std::allocator<andres::graph::Adjacency<unsigned_long>_>_>_>
           ::operator->(local_20);
  VVar3 = andres::graph::Adjacency<unsigned_long>::vertex(pAVar2);
  return VVar3;
}

Assistant:

typename Matching<GRAPH, COST, MASK>::Index
Matching<GRAPH, COST, MASK>::find_star_in_col(Index const col) const
{
    for (auto it = graph_.adjacenciesToVertexBegin(col);
         it != graph_.adjacenciesToVertexEnd(col); ++it)
        if (mask_[it->edge()] == STARRED)
            return it->vertex();

    return IDXMAX;
}